

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O2

void __thiscall DataFileTest::testReadDoubleTwoStep(DataFileTest *this)

{
  DataFileReaderBase *this_00;
  ssize_t sVar1;
  double *__nbytes;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int iVar2;
  auto_ptr<avro::DataFileReaderBase> *this_01;
  ComplexDouble *this_02;
  DataFileReader<Complex<double>_> *this_03;
  unit_test_log_t *this_04;
  element_type *__tmp;
  DataFileReader<Complex<double>_> df;
  int i;
  unit_test_log_t local_1b0;
  undefined1 local_1a8;
  undefined8 *local_1a0;
  char *local_198;
  test_observer local_190;
  DataFileReader<Complex<double>_> *local_188;
  undefined8 local_180;
  double im;
  auto_ptr<avro::DataFileReaderBase> local_170;
  ComplexDouble ci;
  double re;
  auto_ptr<avro::DataFileReaderBase> local_128;
  char *local_120;
  char *local_118;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  this_00 = (DataFileReaderBase *)operator_new(0xe0);
  avro::DataFileReaderBase::DataFileReaderBase(this_00,this->filename);
  local_170._M_ptr = (DataFileReaderBase *)0x0;
  local_188 = &df;
  local_128._M_ptr = this_00;
  avro::DataFileReader<Complex<double>_>::DataFileReader(local_188,&local_128);
  this_01 = &local_128;
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(this_01);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_01,&local_40,0x16e,&local_50);
  local_1a8 = 0;
  local_190._vptr_test_observer = (_func_int **)&PTR__lazy_ostream_001d0ff0;
  local_1b0.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001d0ff0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_a8 = "";
  toString_abi_cxx11_((string *)&ci,&this->writerSchema);
  toString_abi_cxx11_((string *)&re,(ValidSchema *)((long)df.base_._M_ptr + 0x48));
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_1b0,&local_b0,0x16e,1,2,&ci,"toString(writerSchema)",(string *)&re,
             "toString(df.readerSchema())");
  std::__cxx11::string::~string((string *)&re);
  this_02 = &ci;
  std::__cxx11::string::~string((string *)this_02);
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_60.m_end = "";
  local_70.m_begin = "";
  local_70.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_02,&local_60,0x16f,&local_70);
  local_1a8 = 0;
  local_1b0.super_test_observer._vptr_test_observer =
       (test_observer)(test_observer)local_190._vptr_test_observer;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_b8 = "";
  toString_abi_cxx11_((string *)&ci,&this->writerSchema);
  toString_abi_cxx11_((string *)&re,(ValidSchema *)((long)df.base_._M_ptr + 0x58));
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_1b0,&local_c0,0x16f,1,2,&ci,"toString(writerSchema)",(string *)&re,
             "toString(df.dataSchema())");
  std::__cxx11::string::~string((string *)&re);
  std::__cxx11::string::~string((string *)&ci);
  i = 0;
  ci.re = 0.0;
  ci.im = 0.0;
  re = 3.0;
  __nbytes = &im;
  im = 5.0;
  local_188 = &df;
  __buf = extraout_RDX;
  iVar2 = 1;
  while( true ) {
    this_03 = &df;
    sVar1 = avro::DataFileReader<Complex<double>_>::read(this_03,(int)&ci,__buf,(size_t)__nbytes);
    if ((char)sVar1 == '\0') break;
    local_d0.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_d0.m_end = "";
    local_e0.m_begin = "";
    local_e0.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_03,&local_d0,0x175,&local_e0);
    local_1a8 = 0;
    local_1b0.super_test_observer._vptr_test_observer =
         (test_observer)(test_observer)local_190._vptr_test_observer;
    local_1a0 = &boost::unit_test::lazy_ostream::inst;
    local_198 = "";
    local_f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_e8 = "";
    local_180 = 0x3f1a36e2eb1c432d;
    this_04 = &local_1b0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (this_04,&local_f0,0x175,1,8,&ci,"ci.re",&re,"re",&local_180,
               "::boost::math::fpc::percent_tolerance(0.0001)");
    local_100.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_100.m_end = "";
    local_110.m_begin = "";
    local_110.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint(this_04,&local_100,0x176,&local_110);
    local_1a8 = 0;
    local_1b0.super_test_observer._vptr_test_observer =
         (test_observer)(test_observer)local_190._vptr_test_observer;
    local_1a0 = &boost::unit_test::lazy_ostream::inst;
    local_198 = "";
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_118 = "";
    local_180 = 0x3f1a36e2eb1c432d;
    __nbytes = (double *)0x1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (&local_1b0,&local_120,0x176,1,8,&ci.im,"ci.im",&im,"im",&local_180,
               "::boost::math::fpc::percent_tolerance(0.0001)");
    re = im + -0.7 + re;
    im = im + 3.1;
    __buf = extraout_RDX_00;
    i = iVar2;
    iVar2 = iVar2 + 1;
  }
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_80.m_end = "";
  local_90.m_begin = "";
  local_90.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_03,&local_80,0x17b,&local_90);
  local_1a8 = 0;
  local_1b0.super_test_observer._vptr_test_observer =
       (test_observer)(test_observer)local_190._vptr_test_observer;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_98 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_1b0,&local_a0,0x17b,1,2,&i,"i",&count,"count");
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&df.base_);
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&local_170);
  return;
}

Assistant:

void testReadDoubleTwoStep() {
        auto_ptr<avro::DataFileReaderBase>
            base(new avro::DataFileReaderBase(filename));
        avro::DataFileReader<ComplexDouble> df(base);
        BOOST_CHECK_EQUAL(toString(writerSchema), toString(df.readerSchema()));
        BOOST_CHECK_EQUAL(toString(writerSchema), toString(df.dataSchema()));
        int i = 0;
        ComplexDouble ci;
        double re = 3.0;
        double im = 5.0;
        while (df.read(ci)) {
            BOOST_CHECK_CLOSE(ci.re, re, 0.0001);
            BOOST_CHECK_CLOSE(ci.im, im, 0.0001);
            re += (im - 0.7);
            im += 3.1;
            ++i;
        }
        BOOST_CHECK_EQUAL(i, count);
    }